

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.cpp
# Opt level: O2

json_object * __thiscall
json_deserializer::deserialize_json_object
          (json_object *__return_storage_ptr__,json_deserializer *this)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  char cVar7;
  pointer pcVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  json_array jsonArray;
  json_bool jsonBool;
  json_str jsonStr;
  json_str key;
  json_object jsonObject;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_object_*>
  local_118;
  undefined1 local_f0 [17];
  undefined7 uStack_df;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_d8;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Base_ptr local_a8;
  json_object *local_98;
  json_str local_90;
  json_object local_68;
  
  (__return_storage_ptr__->super_json_element)._vptr_json_element =
       (_func_int **)&PTR_get_type_00136ab0;
  aStack_d8._8_8_ = &__return_storage_ptr__->map;
  p_Var1 = &(__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  *(undefined8 *)&(__return_storage_ptr__->map)._M_t._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar5 = &local_118.first.field_2;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_f0 + 0x10);
  local_98 = __return_storage_ptr__;
  do {
    uVar10 = (ulong)(this->reader).index;
    uVar2 = uVar10 + 1;
    if (uVar2 < (this->reader).cbuf._M_string_length) {
      (this->reader).index = (int)uVar2;
      uVar10 = uVar2;
    }
    if ((this->reader).cbuf._M_dataplus._M_p[uVar10] == '}') {
      return local_98;
    }
    deserialize_str(&local_90,this);
    pcVar8 = (this->reader).cbuf._M_dataplus._M_p;
    uVar2 = (this->reader).cbuf._M_string_length;
    uVar10 = (long)(this->reader).index + 1;
    do {
      if (uVar2 <= uVar10) goto LAB_0011bcf8;
      (this->reader).index = (int)uVar10;
      uVar3 = uVar10 + 1;
      pcVar4 = pcVar8 + uVar10;
      uVar10 = uVar3;
    } while (*pcVar4 != ':');
    iVar11 = (int)uVar3;
    if ((ulong)(long)iVar11 < uVar2) {
      (this->reader).index = iVar11;
    }
LAB_0011bcf8:
    uVar9 = current_deserialization_type(this);
    if ((uVar9 & 2) != 0) {
      deserialize_str((json_str *)local_c8,this);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                  *)&local_68,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                  *)aStack_d8._8_8_);
      std::__cxx11::string::string((string *)local_f0,&local_90.value);
      local_118.first._M_string_length = local_f0._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._0_8_ == paVar6) {
        local_118.first.field_2._8_8_ = aStack_d8._M_allocated_capacity;
        local_118.first._M_dataplus._M_p = (pointer)paVar5;
      }
      else {
        local_118.first._M_dataplus._M_p = (pointer)local_f0._0_8_;
      }
      local_118.first.field_2._M_allocated_capacity._1_7_ = uStack_df;
      local_118.first.field_2._M_local_buf[0] = local_f0[0x10];
      local_f0._8_8_ = (pointer)0x0;
      local_f0[0x10] = 0;
      local_118.second = (json_object *)local_c8;
      local_f0._0_8_ = paVar6;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,json_str*>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                  *)&local_68,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_str_*>
                  *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)local_f0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                   *)&local_68);
      json_str::~json_str((json_str *)local_c8);
      goto LAB_0011bfdc;
    }
    uVar9 = current_deserialization_type(this);
    if ((uVar9 & 1) == 0) {
      uVar9 = current_deserialization_type(this);
      if ((uVar9 & 4) != 0) {
        deserialize_number((json_deserializer *)local_f0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                    *)&local_68,
                   (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                    *)aStack_d8._8_8_);
        std::__cxx11::string::string((string *)&local_118,&local_90.value);
        local_c8._8_8_ = local_118.first._M_string_length;
        local_c8._0_8_ = &local_b8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118.first._M_dataplus._M_p == paVar5) {
          local_b8._8_8_ = local_118.first.field_2._8_8_;
        }
        else {
          local_c8._0_8_ = local_118.first._M_dataplus._M_p;
        }
        local_b8._M_allocated_capacity = local_118.first.field_2._M_allocated_capacity;
        local_118.first._M_string_length = 0;
        local_118.first.field_2._M_allocated_capacity =
             local_118.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_a8 = (_Base_ptr)local_f0;
        local_118.first._M_dataplus._M_p = (pointer)paVar5;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,json_number*>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                    *)&local_68,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_number_*>
                    *)local_c8);
        goto LAB_0011bfc4;
      }
      uVar9 = current_deserialization_type(this);
      if ((uVar9 & 0x10) == 0) {
        uVar9 = current_deserialization_type(this);
        if ((uVar9 & 8) != 0) {
          uVar9 = current_deserialization_type(this);
          if ((uVar9 & 0x40) == 0) {
            uVar9 = current_deserialization_type(this);
            if (-1 < (char)uVar9) goto LAB_0011bfdc;
            deserialize_bool_false((json_deserializer *)local_f0);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
            ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                        *)&local_68,
                       (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                        *)aStack_d8._8_8_);
            std::__cxx11::string::string((string *)&local_118,&local_90.value);
            local_c8._8_8_ = local_118.first._M_string_length;
            local_c8._0_8_ = &local_b8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118.first._M_dataplus._M_p == paVar5) {
              local_b8._8_8_ = local_118.first.field_2._8_8_;
            }
            else {
              local_c8._0_8_ = local_118.first._M_dataplus._M_p;
            }
            local_b8._M_allocated_capacity = local_118.first.field_2._M_allocated_capacity;
            local_118.first._M_string_length = 0;
            local_118.first.field_2._M_allocated_capacity =
                 local_118.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_a8 = (_Base_ptr)local_f0;
            local_118.first._M_dataplus._M_p = (pointer)paVar5;
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,json_bool*>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                        *)&local_68,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_bool_*>
                        *)local_c8);
          }
          else {
            deserialize_bool_true((json_deserializer *)local_f0);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
            ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                        *)&local_68,
                       (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                        *)aStack_d8._8_8_);
            std::__cxx11::string::string((string *)&local_118,&local_90.value);
            local_c8._8_8_ = local_118.first._M_string_length;
            local_c8._0_8_ = &local_b8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118.first._M_dataplus._M_p == paVar5) {
              local_b8._8_8_ = local_118.first.field_2._8_8_;
            }
            else {
              local_c8._0_8_ = local_118.first._M_dataplus._M_p;
            }
            local_b8._M_allocated_capacity = local_118.first.field_2._M_allocated_capacity;
            local_118.first._M_string_length = 0;
            local_118.first.field_2._M_allocated_capacity =
                 local_118.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_a8 = (_Base_ptr)local_f0;
            local_118.first._M_dataplus._M_p = (pointer)paVar5;
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,json_bool*>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                        *)&local_68,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_bool_*>
                        *)local_c8);
          }
          goto LAB_0011bfc4;
        }
        uVar9 = current_deserialization_type(this);
        if ((uVar9 & 0x20) != 0) {
          deserialize_json_object(&local_68,this);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                      *)local_c8,
                     (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                      *)aStack_d8._8_8_);
          std::__cxx11::string::string((string *)local_f0,&local_90.value);
          local_118.first._M_string_length = local_f0._8_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._0_8_ == paVar6) {
            local_118.first.field_2._8_8_ = aStack_d8._M_allocated_capacity;
            local_118.first._M_dataplus._M_p = (pointer)paVar5;
          }
          else {
            local_118.first._M_dataplus._M_p = (pointer)local_f0._0_8_;
          }
          local_118.first.field_2._M_allocated_capacity._1_7_ = uStack_df;
          local_118.first.field_2._M_local_buf[0] = local_f0[0x10];
          local_f0._8_8_ = (pointer)0x0;
          local_f0[0x10] = 0;
          local_118.second = &local_68;
          local_f0._0_8_ = paVar6;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,json_object*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                      *)local_c8,&local_118);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)local_f0);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                       *)local_c8);
          json_object::~json_object(&local_68);
        }
      }
      else {
        deserialize_array((json_array *)&local_118,this);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                    *)&local_68,
                   (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                    *)aStack_d8._8_8_);
        std::__cxx11::string::string((string *)local_f0,&local_90.value);
        local_c8._8_8_ = local_f0._8_8_;
        local_c8._0_8_ = &local_b8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._0_8_ == paVar6) {
          local_b8._8_8_ = aStack_d8._M_allocated_capacity;
        }
        else {
          local_c8._0_8_ = local_f0._0_8_;
        }
        local_b8._M_allocated_capacity._1_7_ = uStack_df;
        local_b8._M_local_buf[0] = local_f0[0x10];
        local_f0._8_8_ = (pointer)0x0;
        local_f0[0x10] = 0;
        local_f0._0_8_ = paVar6;
        local_a8 = (_Base_ptr)&local_118;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,json_array*>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                    *)&local_68,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_array_*>
                    *)local_c8);
        std::__cxx11::string::~string((string *)local_c8);
        std::__cxx11::string::~string((string *)local_f0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                     *)&local_68);
        json_array::~json_array((json_array *)&local_118);
      }
    }
    else {
      deserialize_null((json_deserializer *)local_f0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                  *)&local_68,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                  *)aStack_d8._8_8_);
      std::__cxx11::string::string((string *)&local_118,&local_90.value);
      local_c8._8_8_ = local_118.first._M_string_length;
      local_c8._0_8_ = &local_b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.first._M_dataplus._M_p == paVar5) {
        local_b8._8_8_ = local_118.first.field_2._8_8_;
      }
      else {
        local_c8._0_8_ = local_118.first._M_dataplus._M_p;
      }
      local_b8._M_allocated_capacity = local_118.first.field_2._M_allocated_capacity;
      local_118.first._M_string_length = 0;
      local_118.first.field_2._M_allocated_capacity =
           local_118.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_a8 = (_Base_ptr)local_f0;
      local_118.first._M_dataplus._M_p = (pointer)paVar5;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,json_null*>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                  *)&local_68,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_null_*>
                  *)local_c8);
LAB_0011bfc4:
      std::__cxx11::string::~string((string *)local_c8);
      std::__cxx11::string::~string((string *)&local_118);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                   *)&local_68);
    }
LAB_0011bfdc:
    uVar10 = (ulong)(this->reader).index;
    uVar2 = uVar10 + 1;
    if (uVar2 < (this->reader).cbuf._M_string_length) {
      (this->reader).index = (int)uVar2;
      uVar10 = uVar2;
    }
    cVar7 = (this->reader).cbuf._M_dataplus._M_p[uVar10];
    json_str::~json_str(&local_90);
    if (cVar7 == '}') {
      return local_98;
    }
  } while( true );
}

Assistant:

json_object deserialize_json_object() {
        json_object obj;

        while(true) {
            reader.next();

            if (reader.current() == closing_object) {
                return obj;
            }

            json_str key = deserialize_str();

            while (reader.next()) {
                char current = reader.current();
                if (current == ':') {
                    reader.next();
                    break;
                }
            }

            if ((current_deserialization_type() & g_json_str) != 0) {
                json_str jsonStr = deserialize_str();
                obj.kvmap().insert(make_pair(key.str_value(), &jsonStr));
            } else if ((current_deserialization_type() & g_json_null) != 0) {
                json_null jsonNull = deserialize_null();
                obj.kvmap().insert(make_pair(key.str_value(), &jsonNull));
            } else if ((current_deserialization_type() & g_json_number) != 0) {
                json_number jsonNumber = deserialize_number();
                obj.kvmap().insert(make_pair(key.str_value(), &jsonNumber));
            } else if ((current_deserialization_type() & g_json_array) != 0) {
                json_array jsonArray = deserialize_array();
                obj.kvmap().insert(make_pair(key.str_value(), &jsonArray));
            } else if ((current_deserialization_type() & g_json_bool) != 0) {
                if ((current_deserialization_type() & g_json_true) != 0) {
                    json_bool jsonBool = deserialize_bool_true();
                    obj.kvmap().insert(make_pair(key.str_value(), &jsonBool));
                } else if ((current_deserialization_type() & g_json_false) != 0) {
                    json_bool jsonBool = deserialize_bool_false();
                    obj.kvmap().insert(make_pair(key.str_value(), &jsonBool));
                }
            } else if ((current_deserialization_type() & g_json_object) != 0) {
                json_object jsonObject = deserialize_json_object();
                obj.kvmap().insert(make_pair(key.str_value(), &jsonObject));
            }

            reader.next();

            if (reader.current() == closing_object) {
                break;
            }
        }

        return obj;
    }